

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool ON_SubDEdgeSharpness::EqualDelta(ON_SubDEdgeSharpness s0,ON_SubDEdgeSharpness s1)

{
  byte bVar1;
  float fVar2;
  float fVar4;
  double dVar3;
  float fVar5;
  double dVar6;
  
  fVar2 = s0.m_edge_sharpness[0];
  fVar4 = s0.m_edge_sharpness[1];
  fVar5 = s1.m_edge_sharpness[0];
  if ((fVar4 != fVar5) || (NAN(fVar4) || NAN(fVar5))) {
    bVar1 = 0;
  }
  else {
    if ((fVar2 != fVar4) || (NAN(fVar2) || NAN(fVar4))) {
      dVar6 = (double)fVar4 - (double)fVar2;
    }
    else if ((fVar2 != fVar4) || (dVar6 = 0.0, NAN(fVar2) || NAN(fVar4))) {
      dVar6 = ON_DBL_QNAN;
    }
    fVar2 = s1.m_edge_sharpness[1];
    if ((fVar5 != fVar2) || (NAN(fVar5) || NAN(fVar2))) {
      dVar3 = (double)fVar2 - (double)fVar5;
    }
    else if ((fVar5 != fVar2) || (dVar3 = 0.0, NAN(fVar5) || NAN(fVar2))) {
      dVar3 = ON_DBL_QNAN;
    }
    if (((dVar6 == 0.0) && (!NAN(dVar6))) || ((dVar3 == 0.0 && (!NAN(dVar3))))) {
      bVar1 = -(dVar6 == 0.0) & -(dVar3 == 0.0);
    }
    else {
      bVar1 = ABS(dVar6 - dVar3) <= 0.01;
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool ON_SubDEdgeSharpness::EqualDelta(
  ON_SubDEdgeSharpness s0,
  ON_SubDEdgeSharpness s1
)
{
  if (false == (s0.m_edge_sharpness[1] == s1.m_edge_sharpness[0]))
    return false;
  
  const double delta0 = s0.Delta();
  const double delta1 = s1.Delta();

  if (0.0 != delta0 && 0.0 != delta1)
  {
    // fuzzy compare for nonzero deltas
    const double d = fabs(delta0 - delta1);
    return (d <= ON_SubDEdgeSharpness::Tolerance);
  }

  // strict compare for zero deltas.
  return 0.0 == delta0 && 0.0 == delta1;
}